

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

char * __thiscall Path::basename(Path *this,char *__filename)

{
  ulong uVar1;
  size_t sVar2;
  size_t index;
  string *local_18;
  string *path_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *base;
  
  local_18 = (string *)__filename;
  path_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    sVar2 = find_last_slash(local_18);
    if (sVar2 == 0xffffffffffffffff) {
      std::__cxx11::string::string((string *)this,(string *)local_18);
    }
    else {
      std::__cxx11::string::substr((ulong)this,(ulong)local_18);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",(allocator *)((long)&index + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
  }
  return (char *)this;
}

Assistant:

string basename(const string &path)
{
	if (path.empty())
		return "";

	auto index = find_last_slash(path);
	if (index == string::npos)
		return path;

	auto base = path.substr(index + 1, string::npos);
	return base;
}